

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O2

void board::makemove::clearPiece(int square,Board *pos)

{
  int iVar1;
  int sq;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = (long)pos->board[square];
  iVar1 = Board::PIECE_COLOR[lVar7];
  pos->material[iVar1] = pos->material[iVar1] - Board::PIECE_VAL[lVar7];
  pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar7][square];
  pos->board[square] = 0;
  if (Board::PIECE_NO_TEAM[lVar7] == 1) {
    sq = Board::SQ64[square];
    bitboard::clearBit(pos->pawns + iVar1,sq);
    bitboard::clearBit(pos->pawns + 2,sq);
  }
  uVar2 = pos->pNum[lVar7];
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  lVar6 = -1;
  do {
    lVar5 = -1;
    if (lVar6 - uVar4 == -1) break;
    lVar5 = lVar6 + 1;
    lVar3 = lVar6 + 1;
    lVar6 = lVar5;
  } while (pos->pList[lVar7][lVar3] != square);
  pos->pNum[lVar7] = uVar2 - 1;
  pos->pList[lVar7][lVar5] = pos->pList[lVar7 + -1][(long)(int)uVar2 + 9];
  return;
}

Assistant:

inline void board::makemove::clearPiece(const int square, Board& pos)
{
    int piece = pos.getSquare(square);
    int color = Board::PIECE_COLOR[piece];
    int targetPNum = -1;
    pos.addMaterial(color, -1 * Board::PIECE_VAL[piece]);
    pos.hashPiece(piece, square);
    pos.setSquare(square, EMPTY);
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        bitboard::clearBit(pos.getPawns()[color], Board::SQ64[square]);
        bitboard::clearBit(pos.getPawns()[BOTH], Board::SQ64[square]);
    }
    for (int i = 0; i < pos.getPieceNum(piece); i++) {
        if (pos.getPieceList(piece)[i] == square) {
            targetPNum = i;
            break;
        }
    }
    pos.decrementPieceNum(piece);
    pos.getPieceList(piece)[targetPNum] = pos.getPieceList(piece)[pos.getPieceNum(piece)];
}